

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal_cost.c
# Opt level: O0

void BrotliEstimateBitCostsForLiterals(size_t pos,size_t len,size_t mask,uint8_t *data,float *cost)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong local_898;
  double local_890;
  double lit_cost;
  size_t histo;
  size_t i;
  size_t in_window;
  size_t window_half;
  size_t histogram [256];
  float *cost_local;
  uint8_t *data_local;
  size_t mask_local;
  size_t len_local;
  size_t pos_local;
  double local_20;
  double local_10;
  
  iVar1 = BrotliIsMostlyUTF8(data,pos,mask,len,0.75);
  if (iVar1 == 0) {
    memset(&window_half,0,0x800);
    local_898 = len;
    if (2000 < len) {
      local_898 = 2000;
    }
    i = local_898;
    for (histo = 0; histo < local_898; histo = histo + 1) {
      histogram[(ulong)data[pos + histo & mask] - 1] =
           histogram[(ulong)data[pos + histo & mask] - 1] + 1;
    }
    for (histo = 0; histo < len; histo = histo + 1) {
      if (1999 < histo) {
        histogram[(ulong)data[(pos + histo) - 2000 & mask] - 1] =
             histogram[(ulong)data[(pos + histo) - 2000 & mask] - 1] - 1;
        i = i - 1;
      }
      if (histo + 2000 < len) {
        histogram[(ulong)data[pos + histo + 2000 & mask] - 1] =
             histogram[(ulong)data[pos + histo + 2000 & mask] - 1] + 1;
        i = i + 1;
      }
      lit_cost = (double)histogram[(ulong)data[pos + histo & mask] - 1];
      if (lit_cost == 0.0) {
        lit_cost = 4.94065645841247e-324;
      }
      if (i < 0x100) {
        local_10 = kLog2Table[i];
      }
      else {
        auVar2._8_4_ = (int)(i >> 0x20);
        auVar2._0_8_ = i;
        auVar2._12_4_ = 0x45300000;
        local_10 = log2((auVar2._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)i) - 4503599627370496.0));
      }
      if ((ulong)lit_cost < 0x100) {
        local_20 = kLog2Table[(long)lit_cost];
      }
      else {
        auVar3._8_4_ = (int)((ulong)lit_cost >> 0x20);
        auVar3._0_8_ = lit_cost;
        auVar3._12_4_ = 0x45300000;
        local_20 = log2((auVar3._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,SUB84(lit_cost,0)) - 4503599627370496.0));
      }
      local_890 = (local_10 - local_20) + 0.029;
      if (local_890 < 1.0) {
        local_890 = local_890 * 0.5 + 0.5;
      }
      cost[histo] = (float)local_890;
    }
  }
  else {
    EstimateBitCostsForLiteralsUTF8(pos,len,mask,data,cost);
  }
  return;
}

Assistant:

void BrotliEstimateBitCostsForLiterals(size_t pos, size_t len, size_t mask,
                                       const uint8_t* data, float* cost) {
  if (BrotliIsMostlyUTF8(data, pos, mask, len, kMinUTF8Ratio)) {
    EstimateBitCostsForLiteralsUTF8(pos, len, mask, data, cost);
    return;
  } else {
    size_t histogram[256] = { 0 };
    size_t window_half = 2000;
    size_t in_window = BROTLI_MIN(size_t, window_half, len);

    /* Bootstrap histogram. */
    size_t i;
    for (i = 0; i < in_window; ++i) {
      ++histogram[data[(pos + i) & mask]];
    }

    /* Compute bit costs with sliding window. */
    for (i = 0; i < len; ++i) {
      size_t histo;
      if (i >= window_half) {
        /* Remove a byte in the past. */
        --histogram[data[(pos + i - window_half) & mask]];
        --in_window;
      }
      if (i + window_half < len) {
        /* Add a byte in the future. */
        ++histogram[data[(pos + i + window_half) & mask]];
        ++in_window;
      }
      histo = histogram[data[(pos + i) & mask]];
      if (histo == 0) {
        histo = 1;
      }
      {
        double lit_cost = FastLog2(in_window) - FastLog2(histo);
        lit_cost += 0.029;
        if (lit_cost < 1.0) {
          lit_cost *= 0.5;
          lit_cost += 0.5;
        }
        cost[i] = (float)lit_cost;
      }
    }
  }
}